

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ZSTD_seqSymbol_header *DTableH;
  void *ptr;
  ZSTD_seqSymbol *dt_local;
  BIT_DStream_t *bitD_local;
  ZSTD_fseState *DStatePtr_local;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t value;
  U32 regMask;
  
  uVar1 = dt->baseValue;
  uVar2 = bitD->bitsConsumed;
  if (0x1f < uVar1) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  bitD->bitsConsumed = uVar1 + bitD->bitsConsumed;
  DStatePtr->state =
       bitD->bitContainer >> (('@' - (char)uVar2) - (byte)uVar1 & 0x3f) &
       (1L << ((byte)uVar1 & 0x3f)) - 1U;
  if (bitD->bitsConsumed < 0x41) {
    if (bitD->ptr < bitD->limitPtr) {
      if (bitD->ptr != bitD->start) {
        DStatePtr_local._4_4_ = bitD->bitsConsumed >> 3;
        if (bitD->ptr + -(ulong)DStatePtr_local._4_4_ < bitD->start) {
          DStatePtr_local._4_4_ = (int)bitD->ptr - (int)bitD->start;
        }
        bitD->ptr = bitD->ptr + -(ulong)DStatePtr_local._4_4_;
        bitD->bitsConsumed = bitD->bitsConsumed + DStatePtr_local._4_4_ * -8;
        sVar3 = MEM_readLEST(bitD->ptr);
        bitD->bitContainer = sVar3;
      }
    }
    else {
      BIT_reloadDStreamFast(bitD);
    }
  }
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}